

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *o)

{
  undefined1 auVar1 [16];
  Node *pNVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  local_1a;
  Cloner<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
  local_19;
  
  if (o != this) {
    if (o->mNumElements == 0) {
      if (this->mMask != 0) {
        destroy(this);
        this->mKeyVals = (Node *)&this->mMask;
        this->mInfo = (uint8_t *)&this->mMask;
        this->mNumElements = 0;
        this->mMask = 0;
        this->mMaxNumElementsAllowed = 0;
        this->mInfoInc = 0x20;
        this->mInfoHashShift = 0;
      }
    }
    else {
      Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
      ::nodes(&local_1a,this);
      if (this->mMask != o->mMask) {
        if (this->mMask != 0) {
          free(this->mKeyVals);
        }
        uVar3 = o->mMask + 1;
        if (uVar3 < 0x28f5c28f5c28f5d) {
          uVar4 = (uVar3 * 0x50) / 100;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar3 >> 2;
          uVar4 = (SUB168(auVar1 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
        }
        uVar5 = 0xff;
        if (uVar4 < 0xff) {
          uVar5 = uVar4;
        }
        pNVar2 = (Node *)malloc((uVar5 + uVar3) * 0x79 + 8);
        if (pNVar2 == (Node *)0x0) {
          doThrow<std::bad_alloc>();
        }
        this->mKeyVals = pNVar2;
        this->mInfo = (uint8_t *)(pNVar2 + uVar5 + uVar3);
      }
      this->mNumElements = o->mNumElements;
      this->mMask = o->mMask;
      this->mMaxNumElementsAllowed = o->mMaxNumElementsAllowed;
      this->mInfoInc = o->mInfoInc;
      this->mInfoHashShift = o->mInfoHashShift;
      Cloner<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
      ::operator()(&local_19,o,this);
    }
  }
  return this;
}

Assistant:

Table& operator=(Table const& o) {
        ROBIN_HOOD_TRACE(this)
        if (&o == this) {
            // prevent assigning of itself
            return *this;
        }

        // we keep using the old allocator and not assign the new one, because we want to keep
        // the memory available. when it is the same size.
        if (o.empty()) {
            if (0 == mMask) {
                // nothing to do, we are empty too
                return *this;
            }

            // not empty: destroy what we have there
            // clear also resets mInfo to 0, that's sometimes not necessary.
            destroy();
            init();
            WHash::operator=(static_cast<const WHash&>(o));
            WKeyEqual::operator=(static_cast<const WKeyEqual&>(o));
            DataPool::operator=(static_cast<DataPool const&>(o));

            return *this;
        }

        // clean up old stuff
        Destroyer<Self, IsFlat && std::is_trivially_destructible<Node>::value>{}.nodes(*this);

        if (mMask != o.mMask) {
            // no luck: we don't have the same array size allocated, so we need to realloc.
            if (0 != mMask) {
                // only deallocate if we actually have data!
                std::free(mKeyVals);
            }

            auto const numElementsWithBuffer = calcNumElementsWithBuffer(o.mMask + 1);
            mKeyVals = static_cast<Node*>(detail::assertNotNull<std::bad_alloc>(
                std::malloc(calcNumBytesTotal(numElementsWithBuffer))));

            // no need for calloc here because cloneData performs a memcpy.
            mInfo = reinterpret_cast<uint8_t*>(mKeyVals + numElementsWithBuffer);
            // sentinel is set in cloneData
        }
        WHash::operator=(static_cast<const WHash&>(o));
        WKeyEqual::operator=(static_cast<const WKeyEqual&>(o));
        DataPool::operator=(static_cast<DataPool const&>(o));
        mNumElements = o.mNumElements;
        mMask = o.mMask;
        mMaxNumElementsAllowed = o.mMaxNumElementsAllowed;
        mInfoInc = o.mInfoInc;
        mInfoHashShift = o.mInfoHashShift;
        cloneData(o);

        return *this;
    }